

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_binary_expr.hpp
# Opt level: O2

ostream * viennamath::operator<<
                    (ostream *stream,
                    ct_binary_expr<viennamath::ct_constant<1L>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>_>
                    *other)

{
  ostream *poVar1;
  ct_constant<1L> local_3b;
  ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<1L>_>
  local_3a;
  string local_38 [32];
  
  poVar1 = std::operator<<(stream,"[");
  poVar1 = operator<<(poVar1,&local_3b);
  op_mult<double>::str_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = operator<<(poVar1,&local_3a);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_38);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream & stream, ct_binary_expr<LHS, OP, RHS> const & other)
  {
    stream << "[" << other.lhs() << OP().str() << other.rhs() << "]";
    return stream;
  }